

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *
wasm::WATParser::anon_unknown_0::str
          (optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *__return_storage_ptr__,
          string_view in)

{
  ostream *os;
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *extraout_RAX;
  undefined1 auVar5 [8];
  OverflowBehavior in_R8D;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  string_view sv_03;
  string_view sv_04;
  string_view sv_05;
  string_view sv_06;
  string_view sv_07;
  string_view sv_08;
  string_view sv_09;
  string_view in_00;
  undefined1 local_380 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> lexed;
  ios_base local_300 [264];
  undefined1 local_1f8 [8];
  LexStrCtx ctx;
  char *local_48;
  char local_31;
  
  ctx.super_LexCtx.input._M_len = (size_t)in._M_str;
  local_1f8 = (undefined1  [8])in._M_len;
  ctx.super_LexCtx.input._M_str = (char *)0x0;
  ctx.escapeBuilder.
  super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload.field2[0x180] = 0;
  sv._M_str = "\"";
  sv._M_len = 1;
  sVar3 = LexCtx::startsWith((LexCtx *)local_1f8,sv);
  if (sVar3 != 0) {
    ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
    os = (ostream *)
         ((long)&ctx.escapeBuilder.
                 super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload + 8);
    while (sv_00._M_str = "\"", sv_00._M_len = 1,
          sVar4 = LexCtx::startsWith((LexCtx *)local_1f8,sv_00),
          sVar3 = ctx.super_LexCtx.input._M_len, sVar4 == 0) {
      if (local_1f8 == (undefined1  [8])ctx.super_LexCtx.input._M_str) goto LAB_00b7d57e;
      sv_01._M_str = "\\";
      sv_01._M_len = 1;
      sVar3 = LexCtx::startsWith((LexCtx *)local_1f8,sv_01);
      if (sVar3 == 0) {
        if ((ulong)local_1f8 < ctx.super_LexCtx.input._M_str) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr")
          ;
        }
        bVar1 = ctx.super_LexCtx.input._M_str[ctx.super_LexCtx.input._M_len];
        if ((bVar1 < 0x20) || (bVar1 == 0x7f)) goto LAB_00b7d57e;
        if (ctx.escapeBuilder.
            super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload.field2[0x180] == '\x01') {
          local_380[0] = bVar1;
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_380,1);
        }
        ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
      }
      else {
        if (ctx.escapeBuilder.
            super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload.field2[0x180] == '\0') {
          std::__cxx11::stringstream::stringstream((stringstream *)local_380);
          std::optional<std::__cxx11::stringstream>::operator=
                    ((optional<std::__cxx11::stringstream> *)&ctx.super_LexCtx.lexedSize,
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_380);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_380);
          std::ios_base::~ios_base(local_300);
          auVar5 = (undefined1  [8])ctx.super_LexCtx.input._M_str;
          if ((ulong)local_1f8 < ctx.super_LexCtx.input._M_str) {
            auVar5 = local_1f8;
          }
          if (local_1f8 == (undefined1  [8])0x0) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,(char *)(ctx.super_LexCtx.input._M_len + 1),(long)((long)auVar5 + -1));
        }
        ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
        sv_02._M_str = "t";
        sv_02._M_len = 1;
        sVar3 = LexCtx::startsWith((LexCtx *)local_1f8,sv_02);
        if (sVar3 == 0) {
          sv_03._M_str = "n";
          sv_03._M_len = 1;
          sVar3 = LexCtx::startsWith((LexCtx *)local_1f8,sv_03);
          if (sVar3 == 0) {
            sv_04._M_str = "r";
            sv_04._M_len = 1;
            sVar3 = LexCtx::startsWith((LexCtx *)local_1f8,sv_04);
            if (sVar3 == 0) {
              sv_05._M_str = "\\";
              sv_05._M_len = 1;
              sVar3 = LexCtx::startsWith((LexCtx *)local_1f8,sv_05);
              if (sVar3 == 0) {
                sv_06._M_str = "\"";
                sv_06._M_len = 1;
                sVar3 = LexCtx::startsWith((LexCtx *)local_1f8,sv_06);
                if (sVar3 == 0) {
                  sv_07._M_str = "\'";
                  sv_07._M_len = 1;
                  sVar3 = LexCtx::startsWith((LexCtx *)local_1f8,sv_07);
                  if (sVar3 == 0) {
                    sv_08._M_str = "u{";
                    sv_08._M_len = 2;
                    sVar3 = LexCtx::startsWith((LexCtx *)local_1f8,sv_08);
                    if (sVar3 == 0) {
                      if ((ulong)local_1f8 < ctx.super_LexCtx.input._M_str) {
                        std::__throw_out_of_range_fmt
                                  ("%s: __pos (which is %zu) > __size (which is %zu)",
                                   "basic_string_view::substr");
                      }
                      lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._M_value.super_LexResult.span._M_len =
                           (size_t)(ctx.super_LexCtx.input._M_str + ctx.super_LexCtx.input._M_len);
                      lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._M_value.super_LexResult.span._M_str = (char *)0x0;
                      lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._M_value.n._0_5_ = 0;
                      lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._21_4_ = 0;
                      lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._25_4_ = 0;
                      local_380 = (undefined1  [8])
                                  ((long)local_1f8 + -(long)ctx.super_LexCtx.input._M_str);
                      bVar2 = LexIntCtx::takeHexdigit((LexIntCtx *)local_380);
                      if ((!bVar2) ||
                         (bVar2 = LexIntCtx::takeHexdigit((LexIntCtx *)local_380), !bVar2))
                      goto LAB_00b7d57e;
                      if ((lexed.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                           ._M_payload._28_1_ == '\0') &&
                         (lexed.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                          ._M_payload._M_value.super_LexResult.span._M_str != (char *)0x0)) {
                        local_48 = lexed.
                                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                   ._M_payload._M_value.super_LexResult.span._M_str;
                        if ((ulong)local_380 <
                            lexed.
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                            ._M_payload._M_value.super_LexResult.span._M_str) {
                          local_48 = (char *)local_380;
                        }
                        ctx.escapeBuilder.
                        super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._392_8_ = -CONCAT35(lexed.
                                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                             ._M_payload.
                                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                             ._M_payload._M_value.n._5_3_,
                                             lexed.
                                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                             ._M_payload.
                                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                             ._M_payload._M_value.n._0_5_);
                        if (CONCAT31(lexed.
                                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                     ._M_payload._M_value.sign._1_3_,
                                     lexed.
                                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                     ._M_payload._M_value.sign._0_1_) != 2) {
                          ctx.escapeBuilder.
                          super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._392_8_ = CONCAT35(lexed.
                                              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                              ._M_payload.
                                              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                              ._M_payload._M_value.n._5_3_,
                                              lexed.
                                              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                              ._M_payload.
                                              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                              ._M_payload._M_value.n._0_5_);
                        }
                      }
                      ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + (long)local_48
                      ;
                      local_31 = ctx.escapeBuilder.
                                 super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._M_engaged;
                      std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
                    }
                    else {
                      ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 2;
                      if ((ulong)local_1f8 < ctx.super_LexCtx.input._M_str) {
                        std::__throw_out_of_range_fmt
                                  ("%s: __pos (which is %zu) > __size (which is %zu)",
                                   "basic_string_view::substr");
                      }
                      in_00._M_len = ctx.super_LexCtx.input._M_str + ctx.super_LexCtx.input._M_len;
                      in_00._M_str = (char *)0x0;
                      hexnum((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)
                             local_380,
                             (anon_unknown_0 *)
                             ((long)local_1f8 + -(long)ctx.super_LexCtx.input._M_str),in_00,in_R8D);
                      if (lexed.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                          ._M_payload._M_value.sign._0_1_ == '\0') goto LAB_00b7d57e;
                      ctx.super_LexCtx.input._M_str =
                           ctx.super_LexCtx.input._M_str + (long)local_380;
                      sv_09._M_str = "}";
                      sv_09._M_len = 1;
                      sVar3 = LexCtx::startsWith((LexCtx *)local_1f8,sv_09);
                      if (((sVar3 == 0) ||
                          (ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1,
                          (char *)((long)DWORD_ARRAY_00108248 + 0x7db7U) <
                          lexed.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                          ._M_payload._M_value.super_LexResult.span._M_str)) ||
                         (((ulong)lexed.
                                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                  ._M_payload.
                                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                  ._M_payload._M_value.super_LexResult.span._M_str &
                          0xfffffffffffff800) == 0xd800)) goto LAB_00b7d57e;
                      String::writeWTF8CodePoint
                                (os,(uint32_t)
                                    lexed.
                                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                    ._M_payload.
                                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                    ._M_payload._M_value.super_LexResult.span._M_str);
                    }
                  }
                  else {
                    ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
                    local_380[0] = 0x27;
                    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_380,1);
                  }
                }
                else {
                  ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
                  local_380[0] = 0x22;
                  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_380,1);
                }
              }
              else {
                ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
                local_380[0] = 0x5c;
                std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_380,1);
              }
            }
            else {
              ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
              local_380[0] = 0xd;
              std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_380,1);
            }
          }
          else {
            ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
            local_380[0] = 10;
            std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_380,1);
          }
        }
        else {
          ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
          local_380[0] = 9;
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_380,1);
        }
      }
    }
    ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
    if (ctx.super_LexCtx.input._M_str != (char *)0x0) {
      auVar5 = (undefined1  [8])ctx.super_LexCtx.input._M_str;
      if ((ulong)local_1f8 < ctx.super_LexCtx.input._M_str) {
        auVar5 = local_1f8;
      }
      if (ctx.escapeBuilder.
          super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload.field2[0x180] == '\x01') {
        std::__cxx11::stringbuf::str();
        if (local_380 ==
            (undefined1  [8])
            ((long)&lexed.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                    ._M_payload + 8)) {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
            )._M_payload.
            super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
            .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
            _M_payload._M_value.super_LexResult.span = auVar5;
          *(size_t *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                   )._M_payload.
                   super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                   .
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                   ._M_payload._M_value.super_LexResult.span + 8) = sVar3;
          *(undefined1 **)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                   )._M_payload.
                   super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                   .
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                   ._M_payload + 0x10) =
               (undefined1 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                       )._M_payload.
                       super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                       .
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                       ._M_payload + 0x20);
          *(char **)((long)&(__return_storage_ptr__->
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                            )._M_payload.
                            super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                            .
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                            ._M_payload + 0x20) =
               lexed.
               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
               ._M_payload.
               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
               _M_payload._M_value.super_LexResult.span._M_str;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                            )._M_payload.
                            super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                            .
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                            ._M_payload + 0x28) =
               CONCAT35(lexed.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                        ._M_payload._M_value.n._5_3_,
                        lexed.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                        ._M_payload._M_value.n._0_5_);
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
            )._M_payload.
            super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
            .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
            _M_payload._M_value.super_LexResult.span = auVar5;
          *(size_t *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                   )._M_payload.
                   super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                   .
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                   ._M_payload._M_value.super_LexResult.span + 8) = sVar3;
          *(undefined1 (*) [8])
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                   )._M_payload.
                   super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                   .
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                   ._M_payload + 0x10) = local_380;
          *(char **)((long)&(__return_storage_ptr__->
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                            )._M_payload.
                            super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                            .
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                            ._M_payload + 0x20) =
               lexed.
               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
               ._M_payload.
               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
               _M_payload._M_value.super_LexResult.span._M_str;
        }
        *(size_t *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                 )._M_payload.
                 super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                 .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                 ._M_payload + 0x18) =
             lexed.
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
             _M_payload.
             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
             _M_payload._M_value.super_LexResult.span._M_len;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                 )._M_payload.
                 super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                 .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                 ._M_payload + 0x30) = 1;
        (__return_storage_ptr__->
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>).
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
        _M_engaged = true;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->
          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>).
          _M_payload.
          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
          .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
          _M_payload._M_value.super_LexResult.span = auVar5;
        *(size_t *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                 )._M_payload.
                 super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                 .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                 ._M_payload._M_value.super_LexResult.span + 8) = ctx.super_LexCtx.input._M_len;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                 )._M_payload.
                 super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                 .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                 ._M_payload + 0x30) = 0;
        (__return_storage_ptr__->
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>).
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
        _M_engaged = true;
      }
      goto LAB_00b7d586;
    }
  }
LAB_00b7d57e:
  (__return_storage_ptr__->
  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>).
  _M_payload.
  super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>.
  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._M_engaged =
       false;
LAB_00b7d586:
  std::
  _Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&ctx.super_LexCtx.lexedSize);
  return extraout_RAX;
}

Assistant:

std::optional<LexStrResult> str(std::string_view in) {
  LexStrCtx ctx(in);
  if (!ctx.takePrefix("\""sv)) {
    return {};
  }
  while (!ctx.takePrefix("\""sv)) {
    if (ctx.empty()) {
      // TODO: Add error production for unterminated string.
      return {};
    }
    if (ctx.startsWith("\\"sv)) {
      // Escape sequences
      ctx.ensureBuildingEscaped();
      ctx.take(1);
      if (ctx.takePrefix("t"sv)) {
        ctx.appendEscaped('\t');
      } else if (ctx.takePrefix("n"sv)) {
        ctx.appendEscaped('\n');
      } else if (ctx.takePrefix("r"sv)) {
        ctx.appendEscaped('\r');
      } else if (ctx.takePrefix("\\"sv)) {
        ctx.appendEscaped('\\');
      } else if (ctx.takePrefix("\""sv)) {
        ctx.appendEscaped('"');
      } else if (ctx.takePrefix("'"sv)) {
        ctx.appendEscaped('\'');
      } else if (ctx.takePrefix("u{"sv)) {
        auto lexed = hexnum(ctx.next());
        if (!lexed) {
          // TODO: Add error production for malformed unicode escapes.
          return {};
        }
        ctx.take(*lexed);
        if (!ctx.takePrefix("}"sv)) {
          // TODO: Add error production for malformed unicode escapes.
          return {};
        }
        if (!ctx.appendUnicode(lexed->n)) {
          // TODO: Add error production for invalid unicode values.
          return {};
        }
      } else {
        LexIntCtx ictx(ctx.next());
        if (!ictx.takeHexdigit() || !ictx.takeHexdigit()) {
          // TODO: Add error production for unrecognized escape sequence.
          return {};
        }
        auto lexed = *ictx.lexed();
        ctx.take(lexed);
        ctx.appendEscaped(char(lexed.n));
      }
    } else {
      // Normal characters
      if (uint8_t c = ctx.peek(); c >= 0x20 && c != 0x7F) {
        ctx.takeChar();
      } else {
        // TODO: Add error production for unescaped control characters.
        return {};
      }
    }
  }
  return ctx.lexed();
}